

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlAddDefAttrs(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,xmlChar *value)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  xmlHashTablePtr pxVar4;
  xmlChar *pxVar5;
  xmlDefAttr *pxVar6;
  size_t sVar7;
  xmlChar **ppxVar8;
  xmlHashedString xVar9;
  bool local_fa;
  bool local_f9;
  undefined4 uStack_f4;
  undefined4 uStack_e4;
  undefined4 uStack_d4;
  undefined4 uStack_c4;
  int local_b4;
  int newSize;
  xmlDefAttrsPtr temp;
  xmlChar *localname;
  xmlHashedString hvalue;
  xmlHashedString prefix;
  xmlHashedString name;
  int expandedSize;
  int len;
  xmlDefAttr *attr;
  xmlDefAttrsPtr defaults;
  xmlChar *value_local;
  xmlChar *fullattr_local;
  xmlChar *fullname_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->attsSpecial != (xmlHashTablePtr)0x0) &&
     (pvVar3 = xmlHashLookup2(ctxt->attsSpecial,fullname,fullattr), pvVar3 != (void *)0x0)) {
    return;
  }
  if (ctxt->attsDefault == (xmlHashTablePtr)0x0) {
    pxVar4 = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsDefault = pxVar4;
    if (ctxt->attsDefault == (xmlHashTablePtr)0x0) goto LAB_00144d0b;
  }
  pxVar5 = xmlSplitQName3(fullname,(int *)((long)&name.name + 4));
  if (pxVar5 == (xmlChar *)0x0) {
    xVar9 = xmlDictLookupHashed(ctxt->dict,fullname,-1);
    name._0_8_ = xVar9.name;
    prefix.hashValue = 0;
    prefix._4_4_ = 0;
  }
  else {
    xVar9 = xmlDictLookupHashed(ctxt->dict,pxVar5,-1);
    name._0_8_ = xVar9.name;
    xVar9 = xmlDictLookupHashed(ctxt->dict,fullname,name.name._4_4_);
    prefix._0_8_ = xVar9.name;
    hvalue.name = (xmlChar *)CONCAT44(temp._4_4_,xVar9.hashValue);
    if ((xmlChar *)prefix._0_8_ == (xmlChar *)0x0) goto LAB_00144d0b;
  }
  if (name._0_8_ == 0) goto LAB_00144d0b;
  pxVar6 = (xmlDefAttr *)
           xmlHashLookup2(ctxt->attsDefault,(xmlChar *)name._0_8_,(xmlChar *)prefix._0_8_);
  if ((pxVar6 == (xmlDefAttr *)0x0) ||
     (attr = pxVar6, *(int *)&(pxVar6->prefix).field_0x4 <= (int)(pxVar6->prefix).hashValue)) {
    if (pxVar6 == (xmlDefAttr *)0x0) {
      local_b4 = 4;
    }
    else {
      if ((99999999 < *(int *)&(pxVar6->prefix).field_0x4) ||
         (0xffffffffffffff7 < (ulong)(long)*(int *)&(pxVar6->prefix).field_0x4)) goto LAB_00144d0b;
      if (*(int *)&(pxVar6->prefix).field_0x4 < 0x2faf081) {
        local_b4 = *(int *)&(pxVar6->prefix).field_0x4 << 1;
      }
      else {
        local_b4 = 100000000;
      }
    }
    attr = (xmlDefAttr *)(*xmlRealloc)(pxVar6,(long)local_b4 * 0x40 + 8);
    if (attr == (xmlDefAttr *)0x0) goto LAB_00144d0b;
    if (pxVar6 == (xmlDefAttr *)0x0) {
      (attr->prefix).hashValue = 0;
    }
    *(int *)&(attr->prefix).field_0x4 = local_b4;
    iVar2 = xmlHashUpdateEntry2(ctxt->attsDefault,(xmlChar *)name._0_8_,(xmlChar *)prefix._0_8_,attr
                                ,(xmlHashDeallocator)0x0);
    if (iVar2 < 0) {
      (*xmlFree)(attr);
      goto LAB_00144d0b;
    }
  }
  pxVar5 = xmlSplitQName3(fullattr,(int *)((long)&name.name + 4));
  if (pxVar5 == (xmlChar *)0x0) {
    xVar9 = xmlDictLookupHashed(ctxt->dict,fullattr,-1);
    name._0_8_ = xVar9.name;
    prefix.name = (xmlChar *)CONCAT44(uStack_c4,xVar9.hashValue);
    prefix.hashValue = 0;
    prefix._4_4_ = 0;
  }
  else {
    xVar9 = xmlDictLookupHashed(ctxt->dict,pxVar5,-1);
    name._0_8_ = xVar9.name;
    prefix.name = (xmlChar *)CONCAT44(uStack_d4,xVar9.hashValue);
    xVar9 = xmlDictLookupHashed(ctxt->dict,fullattr,name.name._4_4_);
    prefix._0_8_ = xVar9.name;
    hvalue.name = (xmlChar *)CONCAT44(uStack_e4,xVar9.hashValue);
    if ((xmlChar *)prefix._0_8_ == (xmlChar *)0x0) goto LAB_00144d0b;
  }
  if (name._0_8_ != 0) {
    sVar7 = strlen((char *)value);
    name.name._4_4_ = (int)sVar7;
    xVar9 = xmlDictLookupHashed(ctxt->dict,value,name.name._4_4_);
    pxVar5 = xVar9.name;
    if (pxVar5 != (xmlChar *)0x0) {
      sVar7 = strlen((char *)name._0_8_);
      name.name._0_4_ = (int)sVar7;
      if (prefix._0_8_ != 0) {
        sVar7 = strlen((char *)prefix._0_8_);
        name.name._0_4_ = (int)name.name + (int)sVar7;
      }
      uVar1 = (attr->prefix).hashValue;
      (attr->prefix).hashValue = uVar1 + 1;
      ppxVar8 = &attr[(int)uVar1].prefix.name;
      ppxVar8[2] = prefix.name;
      ppxVar8[3] = (xmlChar *)name._0_8_;
      *ppxVar8 = hvalue.name;
      ppxVar8[1] = (xmlChar *)prefix._0_8_;
      ppxVar8[4] = (xmlChar *)CONCAT44(uStack_f4,xVar9.hashValue);
      ppxVar8[5] = pxVar5;
      ppxVar8[6] = pxVar5 + name.name._4_4_;
      local_f9 = true;
      if (ctxt->inSubset != 2) {
        local_fa = false;
        if (ctxt->input->entity != (xmlEntityPtr)0x0) {
          local_fa = ctxt->input->entity->etype == XML_EXTERNAL_PARAMETER_ENTITY;
        }
        local_f9 = local_fa;
      }
      *(uint *)(ppxVar8 + 7) = (uint)local_f9;
      *(int *)((long)(&attr[(int)uVar1].prefix + 4) + 4) = name.name._4_4_ + (int)name.name;
      return;
    }
  }
LAB_00144d0b:
  xmlErrMemory(ctxt);
  return;
}

Assistant:

static void
xmlAddDefAttrs(xmlParserCtxtPtr ctxt,
               const xmlChar *fullname,
               const xmlChar *fullattr,
               const xmlChar *value) {
    xmlDefAttrsPtr defaults;
    xmlDefAttr *attr;
    int len, expandedSize;
    xmlHashedString name;
    xmlHashedString prefix;
    xmlHashedString hvalue;
    const xmlChar *localname;

    /*
     * Allows to detect attribute redefinitions
     */
    if (ctxt->attsSpecial != NULL) {
        if (xmlHashLookup2(ctxt->attsSpecial, fullname, fullattr) != NULL)
	    return;
    }

    if (ctxt->attsDefault == NULL) {
        ctxt->attsDefault = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsDefault == NULL)
	    goto mem_error;
    }

    /*
     * split the element name into prefix:localname , the string found
     * are within the DTD and then not associated to namespace names.
     */
    localname = xmlSplitQName3(fullname, &len);
    if (localname == NULL) {
        name = xmlDictLookupHashed(ctxt->dict, fullname, -1);
	prefix.name = NULL;
    } else {
        name = xmlDictLookupHashed(ctxt->dict, localname, -1);
	prefix = xmlDictLookupHashed(ctxt->dict, fullname, len);
        if (prefix.name == NULL)
            goto mem_error;
    }
    if (name.name == NULL)
        goto mem_error;

    /*
     * make sure there is some storage
     */
    defaults = xmlHashLookup2(ctxt->attsDefault, name.name, prefix.name);
    if ((defaults == NULL) ||
        (defaults->nbAttrs >= defaults->maxAttrs)) {
        xmlDefAttrsPtr temp;
        int newSize;

        if (defaults == NULL) {
            newSize = 4;
        } else {
            if ((defaults->maxAttrs >= XML_MAX_ATTRS) ||
                ((size_t) defaults->maxAttrs >
                     SIZE_MAX / 2 / sizeof(temp[0]) - sizeof(*defaults)))
                goto mem_error;

            if (defaults->maxAttrs > XML_MAX_ATTRS / 2)
                newSize = XML_MAX_ATTRS;
            else
                newSize = defaults->maxAttrs * 2;
        }
        temp = xmlRealloc(defaults,
                          sizeof(*defaults) + newSize * sizeof(xmlDefAttr));
	if (temp == NULL)
	    goto mem_error;
        if (defaults == NULL)
            temp->nbAttrs = 0;
	temp->maxAttrs = newSize;
        defaults = temp;
	if (xmlHashUpdateEntry2(ctxt->attsDefault, name.name, prefix.name,
	                        defaults, NULL) < 0) {
	    xmlFree(defaults);
	    goto mem_error;
	}
    }

    /*
     * Split the attribute name into prefix:localname , the string found
     * are within the DTD and hen not associated to namespace names.
     */
    localname = xmlSplitQName3(fullattr, &len);
    if (localname == NULL) {
        name = xmlDictLookupHashed(ctxt->dict, fullattr, -1);
	prefix.name = NULL;
    } else {
        name = xmlDictLookupHashed(ctxt->dict, localname, -1);
	prefix = xmlDictLookupHashed(ctxt->dict, fullattr, len);
        if (prefix.name == NULL)
            goto mem_error;
    }
    if (name.name == NULL)
        goto mem_error;

    /* intern the string and precompute the end */
    len = strlen((const char *) value);
    hvalue = xmlDictLookupHashed(ctxt->dict, value, len);
    if (hvalue.name == NULL)
        goto mem_error;

    expandedSize = strlen((const char *) name.name);
    if (prefix.name != NULL)
        expandedSize += strlen((const char *) prefix.name);
    expandedSize += len;

    attr = &defaults->attrs[defaults->nbAttrs++];
    attr->name = name;
    attr->prefix = prefix;
    attr->value = hvalue;
    attr->valueEnd = hvalue.name + len;
    attr->external = PARSER_EXTERNAL(ctxt);
    attr->expandedSize = expandedSize;

    return;

mem_error:
    xmlErrMemory(ctxt);
}